

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

void * rw::ps2::mallocalign(size_t size,int32 alignment)

{
  void *pvVar1;
  void **pp;
  void *p;
  int32 alignment_local;
  size_t size_local;
  
  pvVar1 = malloc_LOC(size + (long)alignment + 8,0x30a04,
                      "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp line: 89"
                     );
  if (pvVar1 == (void *)0x0) {
    size_local = 0;
  }
  else {
    size_local = (long)pvVar1 + (long)alignment + 8 & (long)(int)(alignment - 1U ^ 0xffffffff);
    *(void **)(size_local - 8) = pvVar1;
  }
  return (void *)size_local;
}

Assistant:

void*
mallocalign(size_t size, int32 alignment)
{
	void *p;
	void **pp;
	p = rwMalloc(size + alignment + sizeof(void*), MEMDUR_EVENT | ID_RASTERPS2);
	if(p == nil) return nil;
	pp = (void**)(((uintptr)p + sizeof(void*) + alignment)&~(alignment-1));
	pp[-1] = p;
	return (void*)pp;
}